

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingManager.cpp
# Opt level: O1

void __thiscall SLogLib::LoggingManagerPriv::~LoggingManagerPriv(LoggingManagerPriv *this)

{
  long *plVar1;
  LoggingManagerPriv *pLVar2;
  int iVar3;
  undefined8 uVar4;
  LoggingManagerPriv *pLVar5;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mLoggingDevicesMutex);
  if (iVar3 != 0) {
    uVar4 = std::__throw_system_error(iVar3);
    __clang_call_terminate(uVar4);
  }
  for (pLVar5 = (LoggingManagerPriv *)
                (this->mLoggingDevices).
                super__List_base<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
                ._M_impl._M_node.super__List_node_base._M_next; pLVar5 != this;
      pLVar5 = (LoggingManagerPriv *)
               (pLVar5->mLoggingDevices).
               super__List_base<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
               ._M_impl._M_node.super__List_node_base._M_next) {
    plVar1 = (long *)(pLVar5->mLoggingDevices).
                     super__List_base<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
                     ._M_impl._M_node._M_size;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  LOCK();
  _ZN7SLogLibL25gLoggingManagerDestructedE_0 = 1;
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)&this->mLoggingDevicesMutex);
  pLVar5 = (LoggingManagerPriv *)
           (this->mLoggingDevices).
           super__List_base<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (pLVar5 != this) {
    pLVar2 = (LoggingManagerPriv *)
             (pLVar5->mLoggingDevices).
             super__List_base<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    operator_delete(pLVar5);
    pLVar5 = pLVar2;
  }
  return;
}

Assistant:

~LoggingManagerPriv()
	{
		// Destructor should be called by the main thread, just before program dies.
		std::lock_guard<std::mutex> _lock(mLoggingDevicesMutex);
		for(AbstractLoggingDevice* _device : mLoggingDevices)
		{
			delete _device;
		}
		
		gLoggingManagerDestructed = true;
	}